

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

ImageNavigationHeader *
lrit::getHeader<lrit::ImageNavigationHeader>
          (ImageNavigationHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  size_t sVar4;
  size_t sVar5;
  HeaderReader<lrit::ImageNavigationHeader> r;
  string local_78;
  char projectionName [32];
  string local_38;
  
  r.h_.projectionName._M_dataplus._M_p = (pointer)&r.h_.projectionName.field_2;
  r.h_.projectionName._M_string_length = 0;
  r.h_.projectionName.field_2._M_local_buf[0] = '\0';
  r.b_ = b;
  r.p_ = pos;
  HeaderReader<lrit::ImageNavigationHeader>::getHeader(__return_storage_ptr__,&r);
  puVar3 = ((r.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = puVar3 + r.p_;
  projectionName._0_8_ = *(undefined8 *)puVar1;
  projectionName._8_8_ = *(undefined8 *)(puVar1 + 8);
  puVar3 = puVar3 + (long)r.p_ + 0x10;
  projectionName._16_8_ = *(undefined8 *)puVar3;
  projectionName._24_8_ = *(undefined8 *)(puVar3 + 8);
  r.p_ = r.p_ + 0x20;
  sVar4 = strlen(projectionName);
  sVar5 = 0x20;
  if (sVar4 < 0x20) {
    sVar5 = sVar4;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,projectionName,projectionName + sVar5);
  util::trimRight(&local_38,&local_78);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->projectionName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  puVar1 = ((r.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(uint *)(puVar1 + r.p_);
  __return_storage_ptr__->columnScaling =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = *(uint *)(puVar1 + (r.p_ + 4));
  __return_storage_ptr__->lineScaling =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = *(uint *)(puVar1 + (r.p_ + 8));
  __return_storage_ptr__->columnOffset =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = *(uint *)(puVar1 + (r.p_ + 0xc));
  __return_storage_ptr__->lineOffset =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  r.p_ = r.p_ + 0x10;
  std::__cxx11::string::~string((string *)&r.h_.projectionName);
  return __return_storage_ptr__;
}

Assistant:

ImageNavigationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<ImageNavigationHeader>(b, pos);
  auto h = r.getHeader();

  // Read 32 bytes for the projection name
  char projectionName[32];
  r.read(projectionName, sizeof(projectionName));

  // Convert to std::string for return value
  h.projectionName = util::trimRight(std::string(
      projectionName,
      std::min(strlen(projectionName), sizeof(projectionName))));

  r.read(&h.columnScaling);
  r.read(&h.lineScaling);
  r.read(&h.columnOffset);
  r.read(&h.lineOffset);
  return h;
}